

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subject.cpp
# Opt level: O1

void __thiscall Subject::~Subject(Subject *this)

{
  list<Observer_*,_std::allocator<Observer_*>_> *plVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  this->_vptr_Subject = (_func_int **)&PTR_attach_00126be0;
  plVar1 = this->listOfObservers;
  if (plVar1 == (list<Observer_*,_std::allocator<Observer_*>_> *)0x0) {
    return;
  }
  p_Var3 = (plVar1->super__List_base<Observer_*,_std::allocator<Observer_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)plVar1) {
    p_Var2 = (((_List_base<Observer_*,_std::allocator<Observer_*>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  operator_delete(plVar1,0x18);
  return;
}

Assistant:

Subject::~Subject() {
delete listOfObservers;
}